

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

ostream * nonius::detail::operator<<(ostream *os,help_text *h)

{
  bool bVar1;
  _Setw _Var2;
  ostream *poVar3;
  ulong uVar4;
  string *in_RSI;
  option *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> l;
  option o;
  const_iterator __end2;
  const_iterator __begin2;
  option_set *__range2;
  int swidth;
  int lwidth;
  vector<nonius::detail::option,_std::allocator<nonius::detail::option>_> *in_stack_fffffffffffffe28
  ;
  option *in_stack_fffffffffffffe30;
  option *in_stack_fffffffffffffe58;
  option *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_178 [32];
  string local_158 [32];
  string local_138 [48];
  string local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [2];
  string local_a8 [72];
  option *local_60;
  __normal_iterator<const_nonius::detail::option_*,_std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>_>
  local_58;
  undefined8 local_50;
  option *local_40;
  option *local_38;
  int local_30;
  option *local_28;
  option *local_20;
  int local_14;
  option *local_8;
  
  local_8 = in_RDI;
  poVar3 = std::operator<<((ostream *)in_RDI,"Usage: ");
  poVar3 = std::operator<<(poVar3,in_RSI);
  std::operator<<(poVar3," [OPTIONS]\n\n");
  local_20 = (option *)
             std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>::begin
                       (in_stack_fffffffffffffe28);
  local_28 = (option *)
             std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>::end
                       (in_stack_fffffffffffffe28);
  local_14 = operator<<(local_20,local_28);
  local_14 = local_14 + 2;
  local_38 = (option *)
             std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>::begin
                       (in_stack_fffffffffffffe28);
  local_40 = (option *)
             std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>::end
                       (in_stack_fffffffffffffe28);
  local_30 = operator<<(local_38,local_40);
  local_30 = local_30 + 2;
  std::ostream::operator<<(local_8,std::left);
  local_50 = *(undefined8 *)(in_RSI + 0x20);
  local_58._M_current =
       (option *)
       std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>::begin
                 (in_stack_fffffffffffffe28);
  local_60 = (option *)
             std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>::end
                       (in_stack_fffffffffffffe28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_nonius::detail::option_*,_std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>_>
                        *)in_stack_fffffffffffffe30,
                       (__normal_iterator<const_nonius::detail::option_*,_std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>_>
                        *)in_stack_fffffffffffffe28);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_nonius::detail::option_*,_std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>_>
    ::operator*(&local_58);
    __rhs = local_e8;
    option::option(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::operator+((char *)in_RSI,__rhs);
    std::operator+((char *)in_RSI,__rhs);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::operator+((char *)in_RSI,__rhs);
      std::__cxx11::string::operator+=(local_108,local_158);
      std::__cxx11::string::~string(local_158);
      std::operator+((char *)in_RSI,__rhs);
      std::__cxx11::string::operator+=(local_138,local_178);
      std::__cxx11::string::~string(local_178);
    }
    in_stack_fffffffffffffe60 = local_8;
    _Var2 = std::setw(local_14);
    in_stack_fffffffffffffe58 =
         (option *)std::operator<<((ostream *)in_stack_fffffffffffffe60,_Var2);
    poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffe58,local_108);
    _Var2 = std::setw(local_30);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = std::operator<<(poVar3,local_138);
    in_stack_fffffffffffffe30 = (option *)std::operator<<(poVar3,local_a8);
    std::operator<<((ostream *)in_stack_fffffffffffffe30,'\n');
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_108);
    option::~option(in_stack_fffffffffffffe30);
    __gnu_cxx::
    __normal_iterator<const_nonius::detail::option_*,_std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>_>
    ::operator++(&local_58);
  }
  return (ostream *)local_8;
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, help_text h) {
            os << "Usage: " << h.name << " [OPTIONS]\n\n";

            auto lwidth = 2 + get_max_width(h.options.begin(), h.options.end(), [](option const& o) { return 2 + o.long_form.size() + 1 + o.argument.size(); });
            auto swidth = 2 + get_max_width(h.options.begin(), h.options.end(), [](option const& o) { return 1 + o.short_form.size() + 1 + o.argument.size(); });

            os << std::left;
            for(auto o : h.options) {
                auto l = "--" + o.long_form;
                auto s = "-" + o.short_form;
                if(!o.argument.empty()) {
                    l += "=" + o.argument;
                    s += " " + o.argument;
                }
                os << std::setw(lwidth) << l
                   << std::setw(swidth) << s
                   << o.description
                   << '\n';
            }
            return os;
        }